

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-rng-posix-crypto-impl.c
# Opt level: O1

int ndn_lite_posix_rng(uint8_t *dest,uint size)

{
  int __fd;
  ssize_t sVar1;
  uint uVar2;
  
  uVar2 = 0;
  __fd = open("/dev/urandom",0);
  if (-1 < __fd) {
    sVar1 = read(__fd,dest,(ulong)size);
    uVar2 = ~(uint)sVar1 >> 0x1f;
  }
  return uVar2;
}

Assistant:

int
ndn_lite_posix_rng(uint8_t *dest, unsigned size)
{
#if defined(__APPLE__)
  arc4random_buf((void*)dest, size);
  return 1;
#endif
  int randomData = open("/dev/urandom", O_RDONLY);
  if (randomData < 0) {
    return 0;
  }
  else {
    int result = read(randomData, dest, size);
    if (result < 0) {
      return 0;
    }
  }
  return 1;
}